

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3CollapseDatabaseArray(sqlite3 *db)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  long in_RDI;
  Db *pDb;
  int j;
  int i;
  undefined8 *in_stack_ffffffffffffffe8;
  int iVar3;
  int iVar4;
  
  iVar3 = 2;
  for (iVar4 = 2; iVar4 < *(int *)(in_RDI + 0x28); iVar4 = iVar4 + 1) {
    in_stack_ffffffffffffffe8 = (undefined8 *)(*(long *)(in_RDI + 0x20) + (long)iVar4 * 0x20);
    if (in_stack_ffffffffffffffe8[1] == 0) {
      sqlite3DbFree((sqlite3 *)CONCAT44(iVar4,iVar3),in_stack_ffffffffffffffe8);
      *in_stack_ffffffffffffffe8 = 0;
    }
    else {
      if (iVar3 < iVar4) {
        puVar1 = (undefined8 *)(*(long *)(in_RDI + 0x20) + (long)iVar3 * 0x20);
        puVar2 = (undefined8 *)(*(long *)(in_RDI + 0x20) + (long)iVar4 * 0x20);
        *puVar1 = *puVar2;
        puVar1[1] = puVar2[1];
        puVar1[2] = puVar2[2];
        puVar1[3] = puVar2[3];
      }
      iVar3 = iVar3 + 1;
    }
  }
  memset((void *)(*(long *)(in_RDI + 0x20) + (long)iVar3 * 0x20),0,
         (long)(*(int *)(in_RDI + 0x28) - iVar3) << 5);
  *(int *)(in_RDI + 0x28) = iVar3;
  if ((*(int *)(in_RDI + 0x28) < 3) && (*(long *)(in_RDI + 0x20) != in_RDI + 0x2c0)) {
    memcpy((void *)(in_RDI + 0x2c0),*(void **)(in_RDI + 0x20),0x40);
    sqlite3DbFree((sqlite3 *)CONCAT44(iVar4,iVar3),in_stack_ffffffffffffffe8);
    *(long *)(in_RDI + 0x20) = in_RDI + 0x2c0;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CollapseDatabaseArray(sqlite3 *db){
  int i, j;
  for(i=j=2; i<db->nDb; i++){
    struct Db *pDb = &db->aDb[i];
    if( pDb->pBt==0 ){
      sqlite3DbFree(db, pDb->zName);
      pDb->zName = 0;
      continue;
    }
    if( j<i ){
      db->aDb[j] = db->aDb[i];
    }
    j++;
  }
  memset(&db->aDb[j], 0, (db->nDb-j)*sizeof(db->aDb[j]));
  db->nDb = j;
  if( db->nDb<=2 && db->aDb!=db->aDbStatic ){
    memcpy(db->aDbStatic, db->aDb, 2*sizeof(db->aDb[0]));
    sqlite3DbFree(db, db->aDb);
    db->aDb = db->aDbStatic;
  }
}